

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Shared_Image.cxx
# Opt level: O1

void __thiscall Fl_Shared_Image::Fl_Shared_Image(Fl_Shared_Image *this)

{
  Fl_Image::Fl_Image(&this->super_Fl_Image,0,0,0);
  (this->super_Fl_Image)._vptr_Fl_Image = (_func_int **)&PTR__Fl_Shared_Image_00279130;
  this->name_ = (char *)0x0;
  this->original_ = 0;
  this->refcount_ = 1;
  this->image_ = (Fl_Image *)0x0;
  this->alloc_image_ = 0;
  return;
}

Assistant:

Fl_Shared_Image::Fl_Shared_Image() : Fl_Image(0,0,0) {
  name_        = 0;
  refcount_    = 1;
  original_    = 0;
  image_       = 0;
  alloc_image_ = 0;
#if FLTK_ABI_VERSION >= 10304
  scaled_image_= 0;
#endif
}